

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::CoverpointSymbol::checkBins(CoverpointSymbol *this)

{
  Scope *this_00;
  bool bVar1;
  Type *this_01;
  Diagnostic *this_02;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::CoverageBinSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::CoverageBinSymbol>,_(std::ranges::subrange_kind)0>
  sVar2;
  
  this_01 = DeclaredType::getType(&this->declaredType);
  bVar1 = Type::isFloating(this_01);
  if (bVar1) {
    this_00 = (this->super_Symbol).parentScope;
    if ((this->isImplicit == true) && ((this->super_Symbol).name._M_len != 0)) {
      this_02 = Scope::addDiag(this_00,(DiagCode)0xb70006,(this->super_Symbol).location);
      Diagnostic::operator<<(this_02,(this->super_Symbol).name);
      return;
    }
    sVar2 = Scope::membersOfType<slang::ast::CoverageBinSymbol>(&this->super_Scope);
    if ((sVar2._M_begin.current.current == sVar2._M_end.current.current) &&
       (0 < (int)(this_00->compilation->options).languageVersion)) {
      Scope::addDiag(this_00,(DiagCode)0xb50006,(this->super_Symbol).location);
      return;
    }
  }
  return;
}

Assistant:

void CoverpointSymbol::checkBins() const {
    if (getType().isFloating()) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);

        if (isImplicit && !name.empty()) {
            scope->addDiag(diag::RealCoverpointImplicit, location) << name;
        }
        else if (membersOfType<CoverageBinSymbol>().empty()) {
            if (scope->getCompilation().languageVersion() >= LanguageVersion::v1800_2023)
                scope->addDiag(diag::RealCoverpointBins, location);
        }
    }
}